

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

string * __thiscall
duckdb::Timestamp::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Timestamp *this,timestamp_t timestamp)

{
  undefined **ppuVar1;
  date_t date_00;
  dtime_t time_00;
  dtime_t time;
  date_t date;
  dtime_t local_80;
  date_t local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string local_30;
  
  if (this == (Timestamp *)0x8000000000000001) {
    ppuVar1 = &Date::NINF;
  }
  else {
    if (this != (Timestamp *)0x7fffffffffffffff) {
      Convert((timestamp_t)this,&local_74,&local_80);
      Date::ToString_abi_cxx11_(&local_30,(Date *)(ulong)(uint)local_74.days,date_00);
      ::std::operator+(&local_70,&local_30," ");
      Time::ToString_abi_cxx11_(&local_50,(Time *)local_80.micros,time_00);
      ::std::operator+(__return_storage_ptr__,&local_70,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_30);
      return __return_storage_ptr__;
    }
    ppuVar1 = (undefined **)&Date::PINF;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,*ppuVar1,(allocator *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

string Timestamp::ToString(timestamp_t timestamp) {
	if (timestamp == timestamp_t::infinity()) {
		return Date::PINF;
	}
	if (timestamp == timestamp_t::ninfinity()) {
		return Date::NINF;
	}

	date_t date;
	dtime_t time;
	Timestamp::Convert(timestamp, date, time);
	return Date::ToString(date) + " " + Time::ToString(time);
}